

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O1

void find_approximate_solution
               (double *G,double *V,Node_status *node_status,double *space_coordinates,
               Gas_parameters *gas_parameters,Grid *grid,
               Iterative_Method_parameters *iterative_method_parameters)

{
  size_t __size;
  uint uVar1;
  double *rh_side;
  double *unknown_vector;
  double *__ptr;
  ulong uVar2;
  uint uVar3;
  Sparse_matrix lh_side;
  
  uVar3 = grid->X_nodes;
  __size = (ulong)(uVar3 * 2) * 8;
  rh_side = (double *)malloc(__size);
  unknown_vector = (double *)malloc(__size);
  __ptr = (double *)malloc((ulong)(uVar3 * 0x14) << 3);
  Sparse_matrix_Construct(&lh_side,uVar3 * 2,uVar3 * 10 - 10);
  SetRTCAccuracy(iterative_method_parameters->accuracy);
  uVar3 = grid->X_nodes;
  if ((ulong)uVar3 != 0) {
    uVar2 = 0;
    do {
      unknown_vector[uVar2 & 0xffffffff] = *(double *)((long)G + uVar2 * 4);
      unknown_vector[(int)uVar2 + 1] = *(double *)((long)V + uVar2 * 4);
      uVar2 = uVar2 + 2;
    } while ((ulong)uVar3 * 2 != uVar2);
  }
  if (1 < grid->T_nodes) {
    uVar3 = 1;
    do {
      print_info_about_current_iteration(uVar3,grid);
      fill_system(&lh_side,rh_side,grid,node_status,gas_parameters,space_coordinates,uVar3,G,V);
      if (iterative_method_parameters->implementation == Implementation_Native) {
        (*iterative_method_parameters->method)
                  (&lh_side,unknown_vector,rh_side,0x32,
                   iterative_method_parameters->preconditioner_type,
                   iterative_method_parameters->relaxation_constant,
                   iterative_method_parameters->accuracy,__ptr);
      }
      else {
        call_laspack_method(iterative_method_parameters->method_laspack,&lh_side,unknown_vector,
                            rh_side,50.0,iterative_method_parameters->preconditioner_type_laspack,
                            iterative_method_parameters->relaxation_constant);
      }
      uVar1 = grid->X_nodes;
      if ((ulong)uVar1 != 0) {
        uVar2 = 0;
        do {
          *(double *)((long)G + uVar2 * 4) = unknown_vector[uVar2 & 0xffffffff];
          *(double *)((long)V + uVar2 * 4) = unknown_vector[(int)uVar2 + 1];
          uVar2 = uVar2 + 2;
        } while ((ulong)uVar1 * 2 != uVar2);
      }
      V[uVar1 - 1] = 0.0;
      *V = 0.0;
      uVar3 = uVar3 + 1;
    } while (uVar3 < grid->T_nodes);
  }
  Sparse_matrix_Destruct(&lh_side);
  free(unknown_vector);
  free(rh_side);
  free(__ptr);
  return;
}

Assistant:

void find_approximate_solution (
    double * G, 
    double * V, 
    Node_status const * node_status, 
    double const * space_coordinates, 
    Gas_parameters const * gas_parameters,
    Grid const * grid,
    Iterative_Method_parameters const * iterative_method_parameters) {

  // left-hand side of the system
  Sparse_matrix lh_side; 
  // right-hand side of the system
  double * rh_side = NEW(double, 2 * grid->X_nodes); 
  // will be found when we solve the system
  double * unknown_vector = NEW(double, 2 * grid->X_nodes);
  // buffer used by iterative method
  double * buffer = NEW(double, 20 * grid->X_nodes);

  register unsigned time_step;

  unsigned const max_iterations = 50;
  Sparse_matrix_Construct (&lh_side, 2 * grid->X_nodes, 10 * grid->X_nodes - 10);

#ifndef NO_LASPACK
  // iterative algorithm accuracy
  SetRTCAccuracy (iterative_method_parameters->accuracy);
#endif /* NO_LASPACK */

  fill_unknown_vector (G, V, unknown_vector, grid->X_nodes); 

  for (time_step = 1; time_step < grid->T_nodes; ++time_step) {
    // this may slow things up
    print_info_about_current_iteration (time_step, grid);

    fill_system (&lh_side, rh_side, grid, node_status, gas_parameters, space_coordinates, time_step, G, V);

    // launch iteration algorithm
    if (iterative_method_parameters->implementation == Implementation_Native) {
      iterative_method_parameters->method (&lh_side,
              unknown_vector,
              rh_side,
              max_iterations,
              iterative_method_parameters->preconditioner_type,
              iterative_method_parameters->relaxation_constant,
              iterative_method_parameters->accuracy,
              buffer);
    }
#ifndef NO_LASPACK
    else {
      call_laspack_method (
              iterative_method_parameters->method_laspack,
              &lh_side,
              unknown_vector,
              rh_side,
              max_iterations,
              iterative_method_parameters->preconditioner_type_laspack,
              iterative_method_parameters->relaxation_constant);
    }
#endif /* NO_LASPACK */

    fill_approximation (G, V, unknown_vector, grid->X_nodes);
  }

  Sparse_matrix_Destruct (&lh_side);
  free (unknown_vector);
  free (rh_side);
  free (buffer);

  return;
}